

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Validator::validate
          (Validator *this,Reader *type,Reader *value,uint *dataSizeInBits,bool *isPointer)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  uint local_38;
  uint local_34;
  Fault f;
  
  validate(this,type);
  if ((type->_reader).dataSize < 0x10) {
switchD_001964f3_caseD_0:
    *dataSizeInBits = 0;
    *isPointer = false;
    local_38 = 0;
    if ((value->_reader).dataSize < 0x10) {
      return;
    }
    goto LAB_001965f6;
  }
  uVar1 = *(type->_reader).data;
  local_38 = (uint)uVar1;
  uVar2 = (uint)uVar1;
  switch(uVar1) {
  case 0:
    goto switchD_001964f3_caseD_0;
  case 1:
    bVar3 = false;
    goto LAB_0019658d;
  case 2:
    local_38 = 2;
    goto LAB_00196568;
  case 3:
    local_38 = 3;
    goto LAB_00196542;
  case 4:
    local_38 = 4;
    goto LAB_00196586;
  case 5:
    local_38 = 5;
    goto LAB_00196555;
  case 6:
    local_38 = 6;
LAB_00196568:
    uVar2 = 8;
    goto LAB_0019658b;
  case 7:
    local_38 = 7;
    goto LAB_00196542;
  case 8:
    local_38 = 8;
    goto LAB_00196586;
  case 9:
    local_38 = 9;
    goto LAB_00196555;
  case 10:
    local_38 = 10;
LAB_00196586:
    uVar2 = 0x20;
    goto LAB_0019658b;
  case 0xb:
    local_38 = 0xb;
LAB_00196555:
    uVar2 = 0x40;
    goto LAB_0019658b;
  case 0xc:
    local_38 = 0xc;
    break;
  case 0xd:
    local_38 = 0xd;
    break;
  case 0xe:
    local_38 = 0xe;
    break;
  case 0xf:
    local_38 = 0xf;
LAB_00196542:
    uVar2 = 0x10;
LAB_0019658b:
    bVar3 = false;
    goto LAB_0019658d;
  case 0x10:
    local_38 = 0x10;
    break;
  case 0x11:
    local_38 = 0x11;
    break;
  case 0x12:
    local_38 = 0x12;
    break;
  default:
    goto switchD_001964f3_default;
  }
  bVar3 = true;
  uVar2 = 0;
LAB_0019658d:
  *dataSizeInBits = uVar2;
  *isPointer = bVar3;
  if ((value->_reader).dataSize < 0x10) {
    local_34 = 0;
  }
  else {
LAB_001965f6:
    local_34 = (uint)*(value->_reader).data;
    if (local_38 == local_34) {
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x1f1,FAILED,"value.which() == expectedValueType",
             "\"Value did not match type.\", (uint)value.which(), (uint)expectedValueType",
             (char (*) [26])"Value did not match type.",&local_34,&local_38);
  this->isValid = false;
  kj::_::Debug::Fault::~Fault(&f);
switchD_001964f3_default:
  return;
}

Assistant:

void validate(const schema::Type::Reader& type, const schema::Value::Reader& value,
                uint* dataSizeInBits, bool* isPointer) {
    validate(type);

    schema::Value::Which expectedValueType = schema::Value::VOID;
    bool hadCase = false;
    switch (type.which()) {
#define HANDLE_TYPE(name, bits, ptr) \
      case schema::Type::name: \
        expectedValueType = schema::Value::name; \
        *dataSizeInBits = bits; *isPointer = ptr; \
        hadCase = true; \
        break;
      HANDLE_TYPE(VOID, 0, false)
      HANDLE_TYPE(BOOL, 1, false)
      HANDLE_TYPE(INT8, 8, false)
      HANDLE_TYPE(INT16, 16, false)
      HANDLE_TYPE(INT32, 32, false)
      HANDLE_TYPE(INT64, 64, false)
      HANDLE_TYPE(UINT8, 8, false)
      HANDLE_TYPE(UINT16, 16, false)
      HANDLE_TYPE(UINT32, 32, false)
      HANDLE_TYPE(UINT64, 64, false)
      HANDLE_TYPE(FLOAT32, 32, false)
      HANDLE_TYPE(FLOAT64, 64, false)
      HANDLE_TYPE(TEXT, 0, true)
      HANDLE_TYPE(DATA, 0, true)
      HANDLE_TYPE(LIST, 0, true)
      HANDLE_TYPE(ENUM, 16, false)
      HANDLE_TYPE(STRUCT, 0, true)
      HANDLE_TYPE(INTERFACE, 0, true)
      HANDLE_TYPE(ANY_POINTER, 0, true)
#undef HANDLE_TYPE
    }

    if (hadCase) {
      VALIDATE_SCHEMA(value.which() == expectedValueType, "Value did not match type.",
                      (uint)value.which(), (uint)expectedValueType);
    }
  }